

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O2

void __thiscall
QGraphicsProxyWidgetPrivate::removeSubFocusHelper
          (QGraphicsProxyWidgetPrivate *this,QWidget *widget,FocusReason reason)

{
  bool bVar1;
  QObject *pQVar2;
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_48;
  undefined1 *local_38;
  undefined8 uStack_30;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QFocusEvent::QFocusEvent((QFocusEvent *)&local_38,FocusOut,reason);
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  QPointer<QWidget>::QPointer<void>((QPointer<QWidget> *)&local_48,widget);
  QCoreApplication::sendEvent(&widget->super_QObject,(QEvent *)&local_38);
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_48);
  if ((bVar1) && (uStack_30._4_1_ == '\x01')) {
    pQVar2 = &QWidget::style(widget)->super_QObject;
    QCoreApplication::sendEvent(pQVar2,(QEvent *)&local_38);
  }
  QWeakPointer<QObject>::~QWeakPointer(&local_48);
  QFocusEvent::~QFocusEvent((QFocusEvent *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidgetPrivate::removeSubFocusHelper(QWidget *widget, Qt::FocusReason reason)
{
    QFocusEvent event(QEvent::FocusOut, reason);
    QPointer<QWidget> widgetGuard = widget;
    QCoreApplication::sendEvent(widget, &event);
    if (widgetGuard && event.isAccepted())
        QCoreApplication::sendEvent(widget->style(), &event);
}